

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerFactory.cpp
# Opt level: O2

shared_ptr<helics::Broker> helics::BrokerFactory::getConnectedBroker(void)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  SearchableObjectHolder<helics::Broker,_helics::CoreType> *in_RDI;
  shared_ptr<helics::Broker> sVar1;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  local_28._M_unused._M_object = (void *)0x0;
  local_28._8_8_ = 0;
  local_10 = std::
             _Function_handler<bool_(const_std::shared_ptr<helics::Broker>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/BrokerFactory.cpp:237:41)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<bool_(const_std::shared_ptr<helics::Broker>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/BrokerFactory.cpp:237:41)>
             ::_M_manager;
  gmlc::concurrency::SearchableObjectHolder<helics::Broker,_helics::CoreType>::findObject
            (in_RDI,(function<bool_(const_std::shared_ptr<helics::Broker>_&)> *)searchableBrokers);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&local_28);
  sVar1.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)in_RDI;
  return (shared_ptr<helics::Broker>)
         sVar1.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Broker> getConnectedBroker()
{
    return searchableBrokers.findObject([](auto& ptr) { return ptr->isConnected(); });
}